

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void m68k_cpu_transaction_failed_m68k
               (CPUState *cs,hwaddr physaddr,vaddr addr,uint size,MMUAccessType access_type,
               int mmu_idx,MemTxAttrs attrs,MemTxResult response,uintptr_t retaddr)

{
  uint uVar1;
  uint uVar2;
  
  cpu_restore_state_m68k(cs,retaddr,true);
  if (((ulong)cs[1].tb_jmp_cache[0xd1] & 8) == 0) {
    return;
  }
  *(undefined4 *)(cs[1].tb_jmp_cache + 0xbc) = 0;
  uVar2 = (uint)(access_type == MMU_INST_FETCH) +
          (*(uint *)((long)cs[1].tb_jmp_cache + 0x4bc) >> 0xb & 4 |
          *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) & 0xfffffb98) + 0x401;
  *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) = uVar2;
  if (size == 1) {
    uVar1 = 0x20;
  }
  else {
    if (size != 2) goto LAB_0066d465;
    uVar1 = 0x40;
  }
  uVar2 = uVar2 | uVar1;
  *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) = uVar2;
LAB_0066d465:
  if (access_type != MMU_DATA_STORE) {
    *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) = uVar2 | 0x100;
  }
  *(int *)(cs[1].tb_jmp_cache + 0xb7) = (int)addr;
  cs->exception_index = 2;
  cpu_loop_exit_m68k(cs);
}

Assistant:

void m68k_cpu_transaction_failed(CPUState *cs, hwaddr physaddr, vaddr addr,
                                 unsigned size, MMUAccessType access_type,
                                 int mmu_idx, MemTxAttrs attrs,
                                 MemTxResult response, uintptr_t retaddr)
{
    M68kCPU *cpu = M68K_CPU(cs);
    CPUM68KState *env = &cpu->env;

    cpu_restore_state(cs, retaddr, true);

    if (m68k_feature(env, M68K_FEATURE_M68040)) {
        env->mmu.mmusr = 0;
        env->mmu.ssw |= M68K_ATC_040;
        /* FIXME: manage MMU table access error */
        env->mmu.ssw &= ~M68K_TM_040;
        if (env->sr & SR_S) { /* SUPERVISOR */
            env->mmu.ssw |= M68K_TM_040_SUPER;
        }
        if (access_type == MMU_INST_FETCH) { /* instruction or data */
            env->mmu.ssw |= M68K_TM_040_CODE;
        } else {
            env->mmu.ssw |= M68K_TM_040_DATA;
        }
        env->mmu.ssw &= ~M68K_BA_SIZE_MASK;
        switch (size) {
        case 1:
            env->mmu.ssw |= M68K_BA_SIZE_BYTE;
            break;
        case 2:
            env->mmu.ssw |= M68K_BA_SIZE_WORD;
            break;
        case 4:
            env->mmu.ssw |= M68K_BA_SIZE_LONG;
            break;
        }

        if (access_type != MMU_DATA_STORE) {
            env->mmu.ssw |= M68K_RW_040;
        }

        env->mmu.ar = addr;

        cs->exception_index = EXCP_ACCESS;
        cpu_loop_exit(cs);
    }
}